

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O1

void sptk::world::cftb1st(int n,double *a,double *w)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  
  iVar14 = n >> 3;
  uVar8 = iVar14 * 2;
  dVar33 = a[(int)uVar8];
  dVar36 = (a + (int)uVar8)[1];
  dVar29 = a[iVar14 * 6];
  dVar35 = (a + iVar14 * 6)[1];
  dVar6 = dVar33 - dVar29;
  dVar49 = dVar36 - dVar35;
  dVar24 = a[iVar14 * 4];
  dVar23 = (a + iVar14 * 4)[1];
  dVar26 = *a + dVar24;
  dVar43 = -a[1] - dVar23;
  dVar23 = dVar23 - a[1];
  dVar24 = *a - dVar24;
  dVar33 = dVar33 + dVar29;
  dVar36 = dVar36 + dVar35;
  *a = dVar26 + dVar33;
  a[1] = dVar43 - dVar36;
  a[(int)uVar8] = dVar26 - dVar33;
  (a + (int)uVar8)[1] = dVar43 + dVar36;
  a[iVar14 * 4] = dVar24 + dVar49;
  (a + iVar14 * 4)[1] = dVar23 + dVar6;
  a[iVar14 * 6] = dVar24 - dVar49;
  (a + iVar14 * 6)[1] = dVar23 - dVar6;
  dVar6 = w[1];
  dVar49 = w[2];
  dVar33 = w[3];
  lVar9 = (long)(iVar14 + -2);
  if (iVar14 < 5) {
    dVar24 = 0.0;
    dVar35 = 1.0;
    dVar36 = 1.0;
    dVar29 = 0.0;
  }
  else {
    uVar10 = (ulong)uVar8;
    lVar15 = uVar10 - 1;
    lVar19 = uVar10 * 0x20 + -0x10;
    lVar11 = uVar10 + 2;
    lVar17 = uVar10 * 0x10 + 0x10;
    lVar21 = 4;
    dVar23 = 0.0;
    dVar26 = 1.0;
    dVar43 = 0.0;
    dVar37 = 1.0;
    lVar12 = uVar10 * 0x18;
    lVar16 = uVar10 * 0x18;
    lVar7 = uVar10 * 0x10;
    do {
      lVar18 = lVar7 + -0x20;
      lVar20 = lVar16 + 0x20;
      lVar13 = lVar12 + -0x20;
      dVar36 = w[lVar21 + 2];
      dVar44 = (dVar26 + dVar36) * dVar33;
      dVar29 = w[lVar21 + 3];
      dVar27 = (dVar23 + dVar29) * dVar33;
      dVar23 = *(double *)((long)a + lVar17 + 8);
      dVar42 = -a[lVar21 + -1] - dVar23;
      dVar28 = a[lVar21 + -2] + *(double *)((long)a + lVar17);
      dVar23 = dVar23 - a[lVar21 + -1];
      dVar25 = a[lVar21 + -2] - *(double *)((long)a + lVar17);
      dVar47 = a[lVar11];
      dVar48 = (a + lVar11)[1];
      pdVar1 = (double *)((long)a + lVar16 + 0x10);
      dVar35 = *pdVar1;
      dVar24 = pdVar1[1];
      dVar30 = dVar47 + dVar35;
      dVar32 = dVar48 + dVar24;
      dVar47 = dVar47 - dVar35;
      dVar48 = dVar48 - dVar24;
      dVar38 = dVar23 - dVar47;
      dVar40 = dVar25 - dVar48;
      dVar26 = *(double *)((long)a + lVar17 + 0x18);
      dVar34 = -a[lVar21 + 1] - dVar26;
      dVar50 = *(double *)((long)a + lVar17 + 0x10);
      dVar31 = a[lVar21] + dVar50;
      dVar26 = dVar26 - a[lVar21 + 1];
      dVar50 = a[lVar21] - dVar50;
      dVar39 = a[lVar11 + 2];
      dVar41 = (a + lVar11 + 2)[1];
      dVar35 = *(double *)((long)a + lVar20);
      dVar24 = ((double *)((long)a + lVar20))[1];
      dVar51 = dVar39 + dVar35;
      dVar52 = dVar41 + dVar24;
      dVar39 = dVar39 - dVar35;
      dVar41 = dVar41 - dVar24;
      dVar35 = w[lVar21];
      dVar24 = w[lVar21 + 1];
      a[lVar21 + -2] = dVar28 + dVar30;
      a[lVar21 + -1] = dVar42 - dVar32;
      a[lVar21] = dVar31 + dVar51;
      a[lVar21 + 1] = dVar34 - dVar52;
      a[lVar11] = dVar28 - dVar30;
      dVar46 = (dVar37 + dVar35) * dVar49;
      dVar45 = (dVar43 + dVar24) * dVar49;
      a[lVar11 + 1] = dVar32 + dVar42;
      a[lVar11 + 2] = dVar31 - dVar51;
      a[lVar11 + 3] = dVar52 + dVar34;
      dVar47 = dVar47 + dVar23;
      dVar48 = dVar48 + dVar25;
      *(double *)((long)a + lVar17) = dVar48 * dVar46 + -dVar45 * dVar47;
      ((double *)((long)a + lVar17))[1] = dVar47 * dVar46 + dVar45 * dVar48;
      dVar23 = dVar26 + dVar39;
      dVar43 = dVar50 + dVar41;
      dVar37 = dVar23 * dVar35 + dVar24 * dVar43;
      auVar2._8_4_ = SUB84(dVar37,0);
      auVar2._0_8_ = dVar43 * dVar35 + -dVar24 * dVar23;
      auVar2._12_4_ = (int)((ulong)dVar37 >> 0x20);
      *(undefined1 (*) [16])((long)a + lVar17 + 0x10) = auVar2;
      pdVar1 = (double *)((long)a + lVar16 + 0x10);
      *pdVar1 = dVar40 * dVar44 + dVar27 * dVar38;
      pdVar1[1] = dVar38 * dVar44 + -dVar27 * dVar40;
      dVar26 = dVar26 - dVar39;
      dVar50 = dVar50 - dVar41;
      *(double *)((long)a + lVar20) = dVar50 * dVar36 + dVar29 * dVar26;
      ((double *)((long)a + lVar20))[1] = dVar26 * dVar36 + -dVar29 * dVar50;
      dVar23 = *(double *)((long)a + lVar12 + -0x18);
      dVar32 = -a[lVar15 + -2] - dVar23;
      dVar30 = a[lVar15 + -3] + *(double *)((long)a + lVar13);
      dVar23 = dVar23 - a[lVar15 + -2];
      dVar28 = a[lVar15 + -3] - *(double *)((long)a + lVar13);
      dVar31 = *(double *)((long)a + lVar18);
      dVar47 = ((double *)((long)a + lVar18))[1];
      pdVar1 = (double *)((long)a + lVar19 + -0x10);
      dVar26 = *pdVar1;
      dVar43 = pdVar1[1];
      dVar37 = dVar31 + dVar26;
      dVar50 = dVar47 + dVar43;
      dVar31 = dVar31 - dVar26;
      dVar47 = dVar47 - dVar43;
      dVar26 = *(double *)((long)a + lVar12 + -8);
      dVar34 = -a[lVar15] - dVar26;
      dVar43 = *(double *)((long)a + lVar12 + -0x10);
      dVar38 = a[lVar15 + -1] + dVar43;
      dVar26 = dVar26 - a[lVar15];
      dVar43 = a[lVar15 + -1] - dVar43;
      pdVar1 = (double *)((long)a + lVar7 + -0x10);
      dVar48 = *pdVar1;
      dVar39 = pdVar1[1];
      dVar41 = *(double *)((long)a + lVar19);
      dVar25 = ((double *)((long)a + lVar19))[1];
      dVar40 = dVar48 + dVar41;
      dVar42 = dVar39 + dVar25;
      dVar48 = dVar48 - dVar41;
      dVar39 = dVar39 - dVar25;
      a[lVar15 + -1] = dVar38 + dVar40;
      a[lVar15] = dVar34 - dVar42;
      a[lVar15 + -3] = dVar30 + dVar37;
      a[lVar15 + -2] = dVar32 - dVar50;
      *(double *)((long)a + lVar7 + -0x10) = dVar38 - dVar40;
      *(double *)((long)a + lVar7 + -8) = dVar42 + dVar34;
      *(double *)((long)a + lVar18) = dVar30 - dVar37;
      *(double *)((long)a + lVar7 + -0x18) = dVar50 + dVar32;
      dVar37 = dVar26 - dVar48;
      dVar50 = dVar43 - dVar39;
      dVar48 = dVar48 + dVar26;
      dVar39 = dVar39 + dVar43;
      pdVar1 = (double *)((long)a + lVar12 + -0x10);
      *pdVar1 = dVar39 * dVar45 + -dVar46 * dVar48;
      pdVar1[1] = dVar48 * dVar45 + dVar46 * dVar39;
      dVar26 = dVar23 + dVar31;
      dVar43 = dVar28 + dVar47;
      *(double *)((long)a + lVar13) = dVar43 * dVar24 + -dVar35 * dVar26;
      ((double *)((long)a + lVar13))[1] = dVar26 * dVar24 + dVar35 * dVar43;
      dVar26 = dVar37 * dVar27 + -dVar44 * dVar50;
      auVar3._8_4_ = SUB84(dVar26,0);
      auVar3._0_8_ = dVar50 * dVar27 + dVar44 * dVar37;
      auVar3._12_4_ = (int)((ulong)dVar26 >> 0x20);
      *(undefined1 (*) [16])((long)a + lVar19) = auVar3;
      dVar23 = dVar23 - dVar31;
      dVar28 = dVar28 - dVar47;
      pdVar1 = (double *)((long)a + lVar19 + -0x10);
      *pdVar1 = dVar28 * dVar29 + dVar36 * dVar23;
      pdVar1[1] = dVar23 * dVar29 + -dVar36 * dVar28;
      lVar15 = lVar15 + -4;
      lVar19 = lVar19 + -0x20;
      lVar11 = lVar11 + 4;
      lVar17 = lVar17 + 0x20;
      lVar22 = lVar21 + 2;
      lVar21 = lVar21 + 4;
      dVar23 = dVar29;
      dVar26 = dVar36;
      dVar43 = dVar24;
      dVar37 = dVar35;
      lVar12 = lVar13;
      lVar16 = lVar20;
      lVar7 = lVar18;
    } while (lVar22 < lVar9);
  }
  dVar48 = (dVar35 + dVar6) * dVar49;
  dVar49 = (dVar24 + dVar6) * dVar49;
  dVar47 = (dVar36 - dVar6) * dVar33;
  dVar33 = (dVar29 - dVar6) * dVar33;
  lVar12 = (long)(iVar14 * 5);
  dVar31 = -a[(long)iVar14 + -1] - a[lVar12 + -1];
  lVar16 = (long)(iVar14 * 3);
  lVar15 = (long)(iVar14 * 7);
  dVar50 = a[lVar9] + a[lVar12 + -2];
  dVar26 = a[lVar12 + -1] - a[(long)iVar14 + -1];
  dVar43 = a[lVar9] - a[lVar12 + -2];
  dVar24 = a[lVar16 + -2];
  dVar23 = (a + lVar16 + -2)[1];
  dVar36 = a[lVar15 + -2];
  dVar29 = (a + lVar15 + -2)[1];
  dVar35 = dVar24 + dVar36;
  dVar37 = dVar23 + dVar29;
  dVar24 = dVar24 - dVar36;
  dVar23 = dVar23 - dVar29;
  a[lVar9] = dVar50 + dVar35;
  a[(long)iVar14 + -1] = dVar31 - dVar37;
  a[lVar16 + -2] = dVar50 - dVar35;
  a[lVar16 + -1] = dVar37 + dVar31;
  dVar36 = dVar26 + dVar24;
  dVar29 = dVar43 + dVar23;
  dVar35 = dVar36 * dVar48 + dVar49 * dVar29;
  auVar4._8_4_ = SUB84(dVar35,0);
  auVar4._0_8_ = dVar29 * dVar48 + -dVar49 * dVar36;
  auVar4._12_4_ = (int)((ulong)dVar35 >> 0x20);
  *(undefined1 (*) [16])(a + lVar12 + -2) = auVar4;
  dVar26 = dVar26 - dVar24;
  dVar43 = dVar43 - dVar23;
  a[lVar15 + -2] = dVar43 * dVar47 + dVar33 * dVar26;
  (a + lVar15 + -2)[1] = dVar26 * dVar47 + -dVar33 * dVar43;
  dVar24 = a[iVar14] + a[lVar12];
  dVar26 = -a[(long)iVar14 + 1] - a[lVar12 + 1];
  dVar29 = a[iVar14] - a[lVar12];
  dVar35 = a[lVar12 + 1] - a[(long)iVar14 + 1];
  dVar43 = a[lVar16] + a[lVar15];
  dVar37 = a[lVar16 + 1] + a[lVar15 + 1];
  dVar36 = a[lVar16] - a[lVar15];
  dVar23 = a[lVar16 + 1] - a[lVar15 + 1];
  a[iVar14] = dVar24 + dVar43;
  a[(long)iVar14 + 1] = dVar26 - dVar37;
  a[lVar16] = dVar24 - dVar43;
  a[lVar16 + 1] = dVar37 + dVar26;
  dVar24 = dVar29 + dVar23;
  dVar26 = dVar35 + dVar36;
  a[lVar12] = (dVar24 - dVar26) * dVar6;
  a[lVar12 + 1] = (dVar26 + dVar24) * dVar6;
  dVar29 = dVar29 - dVar23;
  dVar35 = dVar35 - dVar36;
  a[lVar15] = (dVar35 + dVar29) * -dVar6;
  a[lVar15 + 1] = (dVar35 - dVar29) * -dVar6;
  dVar6 = -a[(long)iVar14 + 3] - a[lVar12 + 3];
  dVar50 = a[(long)iVar14 + 2] + a[lVar12 + 2];
  dVar23 = a[lVar12 + 3] - a[(long)iVar14 + 3];
  dVar26 = a[(long)iVar14 + 2] - a[lVar12 + 2];
  dVar35 = a[lVar16 + 2];
  dVar24 = (a + lVar16 + 2)[1];
  dVar36 = a[lVar15 + 2];
  dVar29 = (a + lVar15 + 2)[1];
  dVar43 = dVar35 + dVar36;
  dVar37 = dVar24 + dVar29;
  dVar35 = dVar35 - dVar36;
  dVar24 = dVar24 - dVar29;
  a[(long)iVar14 + 2] = dVar50 + dVar43;
  a[(long)iVar14 + 3] = dVar6 - dVar37;
  a[lVar16 + 2] = dVar50 - dVar43;
  a[lVar16 + 3] = dVar37 + dVar6;
  dVar6 = dVar23 + dVar35;
  dVar36 = dVar26 + dVar24;
  dVar29 = dVar6 * dVar49 + dVar48 * dVar36;
  auVar5._8_4_ = SUB84(dVar29,0);
  auVar5._0_8_ = dVar36 * dVar49 + -dVar48 * dVar6;
  auVar5._12_4_ = (int)((ulong)dVar29 >> 0x20);
  *(undefined1 (*) [16])(a + lVar12 + 2) = auVar5;
  dVar23 = dVar23 - dVar35;
  dVar26 = dVar26 - dVar24;
  a[lVar15 + 2] = dVar26 * dVar33 + dVar47 * dVar23;
  (a + lVar15 + 2)[1] = dVar23 * dVar33 + -dVar47 * dVar26;
  return;
}

Assistant:

void cftb1st(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, m, mh;
  double wn4r, csc1, csc3, wk1r, wk1i, wk3r, wk3i,
    wd1r, wd1i, wd3r, wd3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
    y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i;

  mh = n >> 3;
  m = 2 * mh;
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] + a[j2];
  x0i = -a[1] - a[j2 + 1];
  x1r = a[0] - a[j2];
  x1i = -a[1] + a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[0] = x0r + x2r;
  a[1] = x0i - x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i + x2i;
  a[j2] = x1r + x3i;
  a[j2 + 1] = x1i + x3r;
  a[j3] = x1r - x3i;
  a[j3 + 1] = x1i - x3r;
  wn4r = w[1];
  csc1 = w[2];
  csc3 = w[3];
  wd1r = 1;
  wd1i = 0;
  wd3r = 1;
  wd3i = 0;
  k = 0;
  for (j = 2; j < mh - 2; j += 4) {
    k += 4;
    wk1r = csc1 * (wd1r + w[k]);
    wk1i = csc1 * (wd1i + w[k + 1]);
    wk3r = csc3 * (wd3r + w[k + 2]);
    wk3i = csc3 * (wd3i + w[k + 3]);
    wd1r = w[k];
    wd1i = w[k + 1];
    wd3r = w[k + 2];
    wd3i = w[k + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] + a[j2];
    x0i = -a[j + 1] - a[j2 + 1];
    x1r = a[j] - a[j2];
    x1i = -a[j + 1] + a[j2 + 1];
    y0r = a[j + 2] + a[j2 + 2];
    y0i = -a[j + 3] - a[j2 + 3];
    y1r = a[j + 2] - a[j2 + 2];
    y1i = -a[j + 3] + a[j2 + 3];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 + 2] + a[j3 + 2];
    y2i = a[j1 + 3] + a[j3 + 3];
    y3r = a[j1 + 2] - a[j3 + 2];
    y3i = a[j1 + 3] - a[j3 + 3];
    a[j] = x0r + x2r;
    a[j + 1] = x0i - x2i;
    a[j + 2] = y0r + y2r;
    a[j + 3] = y0i - y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i + x2i;
    a[j1 + 2] = y0r - y2r;
    a[j1 + 3] = y0i + y2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2] = wk1r * x0r - wk1i * x0i;
    a[j2 + 1] = wk1r * x0i + wk1i * x0r;
    x0r = y1r + y3i;
    x0i = y1i + y3r;
    a[j2 + 2] = wd1r * x0r - wd1i * x0i;
    a[j2 + 3] = wd1r * x0i + wd1i * x0r;
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3] = wk3r * x0r + wk3i * x0i;
    a[j3 + 1] = wk3r * x0i - wk3i * x0r;
    x0r = y1r - y3i;
    x0i = y1i - y3r;
    a[j3 + 2] = wd3r * x0r + wd3i * x0i;
    a[j3 + 3] = wd3r * x0i - wd3i * x0r;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] + a[j2];
    x0i = -a[j0 + 1] - a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = -a[j0 + 1] + a[j2 + 1];
    y0r = a[j0 - 2] + a[j2 - 2];
    y0i = -a[j0 - 1] - a[j2 - 1];
    y1r = a[j0 - 2] - a[j2 - 2];
    y1i = -a[j0 - 1] + a[j2 - 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 - 2] + a[j3 - 2];
    y2i = a[j1 - 1] + a[j3 - 1];
    y3r = a[j1 - 2] - a[j3 - 2];
    y3i = a[j1 - 1] - a[j3 - 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i - x2i;
    a[j0 - 2] = y0r + y2r;
    a[j0 - 1] = y0i - y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i + x2i;
    a[j1 - 2] = y0r - y2r;
    a[j1 - 1] = y0i + y2i;
    x0r = x1r + x3i;
    x0i = x1i + x3r;
    a[j2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 1] = wk1i * x0i + wk1r * x0r;
    x0r = y1r + y3i;
    x0i = y1i + y3r;
    a[j2 - 2] = wd1i * x0r - wd1r * x0i;
    a[j2 - 1] = wd1i * x0i + wd1r * x0r;
    x0r = x1r - x3i;
    x0i = x1i - x3r;
    a[j3] = wk3i * x0r + wk3r * x0i;
    a[j3 + 1] = wk3i * x0i - wk3r * x0r;
    x0r = y1r - y3i;
    x0i = y1i - y3r;
    a[j3 - 2] = wd3i * x0r + wd3r * x0i;
    a[j3 - 1] = wd3i * x0i - wd3r * x0r;
  }
  wk1r = csc1 * (wd1r + wn4r);
  wk1i = csc1 * (wd1i + wn4r);
  wk3r = csc3 * (wd3r - wn4r);
  wk3i = csc3 * (wd3i - wn4r);
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0 - 2] + a[j2 - 2];
  x0i = -a[j0 - 1] - a[j2 - 1];
  x1r = a[j0 - 2] - a[j2 - 2];
  x1i = -a[j0 - 1] + a[j2 - 1];
  x2r = a[j1 - 2] + a[j3 - 2];
  x2i = a[j1 - 1] + a[j3 - 1];
  x3r = a[j1 - 2] - a[j3 - 2];
  x3i = a[j1 - 1] - a[j3 - 1];
  a[j0 - 2] = x0r + x2r;
  a[j0 - 1] = x0i - x2i;
  a[j1 - 2] = x0r - x2r;
  a[j1 - 1] = x0i + x2i;
  x0r = x1r + x3i;
  x0i = x1i + x3r;
  a[j2 - 2] = wk1r * x0r - wk1i * x0i;
  a[j2 - 1] = wk1r * x0i + wk1i * x0r;
  x0r = x1r - x3i;
  x0i = x1i - x3r;
  a[j3 - 2] = wk3r * x0r + wk3i * x0i;
  a[j3 - 1] = wk3r * x0i - wk3i * x0r;
  x0r = a[j0] + a[j2];
  x0i = -a[j0 + 1] - a[j2 + 1];
  x1r = a[j0] - a[j2];
  x1i = -a[j0 + 1] + a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[j0] = x0r + x2r;
  a[j0 + 1] = x0i - x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i + x2i;
  x0r = x1r + x3i;
  x0i = x1i + x3r;
  a[j2] = wn4r * (x0r - x0i);
  a[j2 + 1] = wn4r * (x0i + x0r);
  x0r = x1r - x3i;
  x0i = x1i - x3r;
  a[j3] = -wn4r * (x0r + x0i);
  a[j3 + 1] = -wn4r * (x0i - x0r);
  x0r = a[j0 + 2] + a[j2 + 2];
  x0i = -a[j0 + 3] - a[j2 + 3];
  x1r = a[j0 + 2] - a[j2 + 2];
  x1i = -a[j0 + 3] + a[j2 + 3];
  x2r = a[j1 + 2] + a[j3 + 2];
  x2i = a[j1 + 3] + a[j3 + 3];
  x3r = a[j1 + 2] - a[j3 + 2];
  x3i = a[j1 + 3] - a[j3 + 3];
  a[j0 + 2] = x0r + x2r;
  a[j0 + 3] = x0i - x2i;
  a[j1 + 2] = x0r - x2r;
  a[j1 + 3] = x0i + x2i;
  x0r = x1r + x3i;
  x0i = x1i + x3r;
  a[j2 + 2] = wk1i * x0r - wk1r * x0i;
  a[j2 + 3] = wk1i * x0i + wk1r * x0r;
  x0r = x1r - x3i;
  x0i = x1i - x3r;
  a[j3 + 2] = wk3i * x0r + wk3r * x0i;
  a[j3 + 3] = wk3i * x0i - wk3r * x0r;
}